

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void Hc3Zip_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  uint uVar3;
  int iVar4;
  int in_ESI;
  long *in_RDI;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  int local_c;
  
  local_c = in_ESI;
  do {
    if (*(uint *)((long)in_RDI + 0x14) < 3) {
      MatchFinder_MovePos((CMatchFinder *)0x12044a);
    }
    else {
      puVar2 = (undefined1 *)*in_RDI;
      uVar3 = ((uint)CONCAT11(*puVar2,puVar2[2]) ^
              *(uint *)((long)in_RDI + (ulong)(byte)puVar2[1] * 4 + 0x78)) & 0xffff;
      uVar1 = *(undefined4 *)(in_RDI[5] + (ulong)uVar3 * 4);
      *(int *)(in_RDI[5] + (ulong)uVar3 * 4) = (int)in_RDI[1];
      *(undefined4 *)(in_RDI[6] + (ulong)*(uint *)(in_RDI + 3) * 4) = uVar1;
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
      *in_RDI = *in_RDI + 1;
      iVar4 = (int)in_RDI[1] + 1;
      *(int *)(in_RDI + 1) = iVar4;
      if (iVar4 == *(int *)((long)in_RDI + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)0x120510);
      }
    }
    local_c = local_c + -1;
  } while (local_c != 0);
  return;
}

Assistant:

void Hc3Zip_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    SKIP_HEADER(3)
    HASH_ZIP_CALC;
    curMatch = p->hash[hv];
    p->hash[hv] = p->pos;
    p->son[p->cyclicBufferPos] = curMatch;
    MOVE_POS
  }
  while (--num != 0);
}